

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

void __thiscall CCNR::ls_solver::simple_print(ls_solver *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,'\t');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\t');
  poVar1 = std::ostream::_M_insert<double>(this->_best_cost_time);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ls_solver::simple_print() { cout << '\t' << _best_found_cost << '\t' << _best_cost_time << endl; }